

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_wakeupvm(HSQUIRRELVM v,SQBool wakeupret,SQBool retval,SQBool raiseerror,
                    SQBool throwerror)

{
  bool bVar1;
  SQObjectPtr *pSVar2;
  SQObjectPtr *this;
  undefined1 local_70 [8];
  SQObjectPtr dummy;
  SQInteger target;
  undefined1 local_48 [8];
  SQObjectPtr ret;
  SQBool throwerror_local;
  SQBool raiseerror_local;
  SQBool retval_local;
  SQBool wakeupret_local;
  HSQUIRRELVM v_local;
  
  ret.super_SQObject._unVal = (SQObjectValue)throwerror;
  SQObjectPtr::SQObjectPtr((SQObjectPtr *)local_48);
  if (v->_suspended == 0) {
    v_local = (HSQUIRRELVM)sq_throwerror(v,"cannot resume a vm that is not running any code");
  }
  else {
    dummy.super_SQObject._unVal = (SQObjectValue)v->_suspended_target;
    if (wakeupret == 0) {
      if (dummy.super_SQObject._unVal.pTable != (SQTable *)0xffffffffffffffff) {
        pSVar2 = SQVM::GetAt(v,v->_stackbase + v->_suspended_target);
        SQObjectPtr::Null(pSVar2);
      }
    }
    else {
      if (dummy.super_SQObject._unVal.pTable != (SQTable *)0xffffffffffffffff) {
        pSVar2 = SQVM::GetUp(v,-1);
        this = SQVM::GetAt(v,v->_stackbase + v->_suspended_target);
        SQObjectPtr::operator=(this,pSVar2);
      }
      SQVM::Pop(v);
    }
    SQObjectPtr::SQObjectPtr((SQObjectPtr *)local_70);
    bVar1 = SQVM::Execute(v,(SQObjectPtr *)local_70,-1,-1,(SQObjectPtr *)local_48,raiseerror,
                          ET_RESUME_THROW_VM - (ret.super_SQObject._unVal.pTable == (SQTable *)0x0))
    ;
    if (bVar1) {
      if (retval != 0) {
        SQVM::Push(v,(SQObjectPtr *)local_48);
      }
      v_local = (HSQUIRRELVM)0x0;
    }
    else {
      v_local = (HSQUIRRELVM)0xffffffffffffffff;
    }
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_70);
  }
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_48);
  return (SQRESULT)v_local;
}

Assistant:

SQRESULT sq_wakeupvm(HSQUIRRELVM v,SQBool wakeupret,SQBool retval,SQBool raiseerror,SQBool throwerror)
{
    SQObjectPtr ret;
    if(!v->_suspended)
        return sq_throwerror(v,_SC("cannot resume a vm that is not running any code"));
    SQInteger target = v->_suspended_target;
    if(wakeupret) {
        if(target != -1) {
            v->GetAt(v->_stackbase+v->_suspended_target)=v->GetUp(-1); //retval
        }
        v->Pop();
    } else if(target != -1) { v->GetAt(v->_stackbase+v->_suspended_target).Null(); }
    SQObjectPtr dummy;
    if(!v->Execute(dummy,-1,-1,ret,raiseerror,throwerror?SQVM::ET_RESUME_THROW_VM : SQVM::ET_RESUME_VM)) {
        return SQ_ERROR;
    }
    if(retval)
        v->Push(ret);
    return SQ_OK;
}